

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O1

optional<ChainType> GetNetworkForMagic(MessageStartChars *message)

{
  ulong uVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  MessageStartChars signet_msg;
  MessageStartChars regtest_msg;
  MessageStartChars testnet4_msg;
  MessageStartChars testnet_msg;
  MessageStartChars mainnet_msg;
  undefined1 local_b8 [16];
  undefined1 local_a8 [32];
  undefined1 local_88 [32];
  size_t sStack_68;
  __node_base local_60;
  size_type sStack_58;
  _Prime_rehash_policy local_50;
  __node_base_ptr local_40;
  undefined1 local_38;
  uint32_t local_28;
  uint32_t local_24;
  int local_20;
  int local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  CChainParams::Main();
  local_1c = *(int *)(local_a8._0_8_ + 0x170);
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)
             (local_b8 + 0x10));
  CChainParams::TestNet();
  local_20 = *(int *)(local_a8._0_8_ + 0x170);
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)
             (local_b8 + 0x10));
  CChainParams::TestNet4();
  local_24 = *(uint32_t *)(local_a8._0_8_ + 0x170);
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)
             (local_b8 + 0x10));
  local_a8._16_8_ = 0;
  local_a8._24_8_ = 0;
  local_a8._0_8_ = local_88 + 0x10;
  local_a8[8] = '\x01';
  local_a8[9] = '\0';
  local_a8[10] = '\0';
  local_a8[0xb] = '\0';
  local_a8[0xc] = '\0';
  local_a8[0xd] = '\0';
  local_a8[0xe] = '\0';
  local_a8[0xf] = '\0';
  local_88._0_8_ = 0x3f800000;
  local_88._24_8_ = &local_40;
  local_88._8_8_ = (_Base_ptr)0x0;
  local_88._16_8_ = (_Base_ptr)0x0;
  sStack_68 = 1;
  local_60._M_nxt = (_Hash_node_base *)0x0;
  sStack_58 = 0;
  local_50._M_max_load_factor = 1.0;
  local_50._4_4_ = 0;
  local_50._M_next_resize = 0;
  local_40 = (__node_base_ptr)0x0;
  local_38 = 0;
  CChainParams::RegTest((CChainParams *)local_b8,(RegTestOptions *)(local_b8 + 0x10));
  local_28 = *(uint32_t *)((MessageStartChars *)(local_b8._0_8_ + 0x170))->_M_elems;
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)local_b8);
  std::
  _Hashtable<Consensus::BuriedDeployment,_std::pair<const_Consensus::BuriedDeployment,_int>,_std::allocator<std::pair<const_Consensus::BuriedDeployment,_int>_>,_std::__detail::_Select1st,_std::equal_to<Consensus::BuriedDeployment>,_std::hash<Consensus::BuriedDeployment>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<Consensus::BuriedDeployment,_std::pair<const_Consensus::BuriedDeployment,_int>,_std::allocator<std::pair<const_Consensus::BuriedDeployment,_int>_>,_std::__detail::_Select1st,_std::equal_to<Consensus::BuriedDeployment>,_std::hash<Consensus::BuriedDeployment>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)((long)local_88 + 0x18));
  std::
  _Hashtable<Consensus::DeploymentPos,_std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>,_std::allocator<std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>_>,_std::__detail::_Select1st,_std::equal_to<Consensus::DeploymentPos>,_std::hash<Consensus::DeploymentPos>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<Consensus::DeploymentPos,_std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>,_std::allocator<std::pair<const_Consensus::DeploymentPos,_CChainParams::VersionBitsParameters>_>,_std::__detail::_Select1st,_std::equal_to<Consensus::DeploymentPos>,_std::hash<Consensus::DeploymentPos>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)(local_b8 + 0x10));
  local_a8._24_8_ = local_a8._24_8_ & 0xffffffffffffff00;
  local_88._24_8_ = local_88._24_8_ & 0xffffffffffffff00;
  CChainParams::SigNet((CChainParams *)local_b8,(SigNetOptions *)(local_b8 + 0x10));
  local_b8._12_4_ = *(undefined4 *)((MessageStartChars *)(local_b8._0_8_ + 0x170))->_M_elems;
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)local_b8);
  if (local_88[0x18] == '\x01') {
    local_88._24_8_ = local_88._24_8_ & 0xffffffffffffff00;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_a8 + 0x20));
  }
  if (local_a8[0x18] == '\x01') {
    local_a8._24_8_ = local_a8._24_8_ & 0xffffffffffffff00;
    if ((undefined1 *)local_a8._0_8_ != (undefined1 *)0x0) {
      operator_delete((void *)local_a8._0_8_,local_a8._16_8_ - local_a8._0_8_);
    }
  }
  uVar1 = 0x100000000;
  if (*(int *)message->_M_elems == local_1c) {
    uVar2 = 0;
  }
  else if (*(int *)message->_M_elems == local_20) {
    uVar2 = 1;
  }
  else if (*(uint32_t *)message->_M_elems == local_24) {
    uVar2 = 4;
  }
  else if (*(uint32_t *)message->_M_elems == local_28) {
    uVar2 = 3;
  }
  else {
    if (*(int *)message->_M_elems != local_b8._12_4_) {
      uVar1 = 0;
    }
    uVar2 = 2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (optional<ChainType>)(uVar1 | uVar2);
  }
  __stack_chk_fail();
}

Assistant:

std::optional<ChainType> GetNetworkForMagic(const MessageStartChars& message)
{
    const auto mainnet_msg = CChainParams::Main()->MessageStart();
    const auto testnet_msg = CChainParams::TestNet()->MessageStart();
    const auto testnet4_msg = CChainParams::TestNet4()->MessageStart();
    const auto regtest_msg = CChainParams::RegTest({})->MessageStart();
    const auto signet_msg = CChainParams::SigNet({})->MessageStart();

    if (std::ranges::equal(message, mainnet_msg)) {
        return ChainType::MAIN;
    } else if (std::ranges::equal(message, testnet_msg)) {
        return ChainType::TESTNET;
    } else if (std::ranges::equal(message, testnet4_msg)) {
        return ChainType::TESTNET4;
    } else if (std::ranges::equal(message, regtest_msg)) {
        return ChainType::REGTEST;
    } else if (std::ranges::equal(message, signet_msg)) {
        return ChainType::SIGNET;
    }
    return std::nullopt;
}